

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O3

ByteData256 * cfd::core::HashUtil::Sha256(ByteData256 *__return_storage_ptr__,Script *script)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  ByteData local_28;
  
  Script::GetData(&local_28,script);
  ByteData::GetBytes(&local_40,&local_28);
  Sha256(__return_storage_ptr__,&local_40);
  if (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData256 HashUtil::Sha256(const Script &script) {
  return Sha256(script.GetData().GetBytes());
}